

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::EytzingerLayoutSorter::Sort
          (EytzingerLayoutSorter *this,size_t output_index)

{
  uint uVar1;
  size_type i;
  uint *puVar2;
  reference puVar3;
  
  for (; output_index < (this->input).len_; output_index = output_index * 2 + 2) {
    Sort(this,output_index * 2 + 1);
    i = this->i;
    this->i = i + 1;
    puVar2 = (uint *)absl::lts_20250127::Span<const_int>::operator[](&this->input,i);
    uVar1 = *puVar2;
    puVar3 = absl::lts_20250127::Span<unsigned_int>::operator[](&this->output,output_index);
    *puVar3 = uVar1;
  }
  return;
}

Assistant:

void Sort(size_t output_index = 0) {
    if (output_index < input.size()) {
      Sort(2 * output_index + 1);
      output[output_index] = input[i++];
      Sort(2 * output_index + 2);
    }
  }